

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

logical pnga_create_mutexes(Integer num)

{
  int iVar1;
  long in_RDI;
  int myshare;
  Integer in_stack_00000188;
  char *in_stack_00000190;
  logical local_8;
  
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if ((in_RDI < 1) || (0x8000 < in_RDI)) {
    local_8 = 0;
  }
  else {
    if (num_mutexes != 0) {
      pnga_error(in_stack_00000190,in_stack_00000188);
    }
    num_mutexes = (int)in_RDI;
    if (GAnproc == 1) {
      local_8 = 1;
    }
    else {
      chunk_mutex = (int)((in_RDI + GAnproc + -1) / GAnproc);
      iVar1 = ARMCI_Create_mutexes(0);
      if (iVar1 == 0) {
        local_8 = 1;
      }
      else {
        local_8 = 0;
      }
    }
  }
  return local_8;
}

Assistant:

logical pnga_create_mutexes(Integer num)
{
int myshare;

   _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
   if (num <= 0 || num > MAX_MUTEXES) return(FALSE);
   if(num_mutexes) pnga_error("mutexes already created",num_mutexes);

   num_mutexes= (int)num;

   if(GAnproc == 1){
      return(TRUE);
   }
   chunk_mutex = (int)((num + GAnproc-1)/GAnproc);
   if(GAme * chunk_mutex >= num)myshare =0;
   else myshare=chunk_mutex;

   /* need work here to use permutation */
   if(ARMCI_Create_mutexes(myshare)){
      return FALSE;
   }
   return TRUE;
}